

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.h
# Opt level: O2

void __thiscall mvm::ip::increment(ip *this,uintptr_t inc)

{
  undefined8 *puVar1;
  allocator<char> local_31;
  string local_30 [32];
  
  if (!CARRY8(inc,this->m_val)) {
    this->m_val = inc + this->m_val;
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"[-][mvm] bytecode overflow",&local_31);
  *puVar1 = &PTR__mexcept_00178098;
  *(undefined2 *)(puVar1 + 1) = 6;
  __cxa_throw(puVar1,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

void increment(uintptr_t inc) {
    if (m_val > (std::numeric_limits<uintptr_t>::max() - inc)) {
      throw mexcept{"[-][mvm] bytecode overflow", status_type::CODE_OVERFLOW};
    }

    m_val += inc;
    LOG_INFO("ip -> update ip, (base, val) = (" << m_base << "," << m_val
                                                << ")");
  }